

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratedFileStream *cmakefileStream,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lGenerators)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  bool bVar1;
  TargetType TVar2;
  size_type sVar3;
  reference ppcVar4;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar5;
  ostream *poVar6;
  undefined1 local_90 [8];
  string tname;
  cmGeneratorTarget *gt;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_58;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_50;
  iterator l;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> tgts;
  uint i;
  cmLocalUnixMakefileGenerator3 *lg;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lGenerators_local;
  cmGeneratedFileStream *cmakefileStream_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  std::operator<<((ostream *)cmakefileStream,"# Dependency information for all targets:\n");
  std::operator<<((ostream *)cmakefileStream,"set(CMAKE_DEPEND_INFO_FILES\n");
  tgts.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  do {
    sVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size(lGenerators);
    if (sVar3 <= tgts.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
      std::operator<<((ostream *)cmakefileStream,"  )\n");
      return;
    }
    ppcVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lGenerators,
                         (ulong)tgts.
                                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    this_00 = (cmLocalUnixMakefileGenerator3 *)*ppcVar4;
    __x = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)this_00);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l,__x);
    local_50._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l);
    while( true ) {
      local_58._M_current =
           (cmGeneratorTarget **)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l);
      bVar1 = __gnu_cxx::operator!=(&local_50,&local_58);
      if (!bVar1) break;
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_50);
      TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
      if (TVar2 == EXECUTABLE) {
LAB_0070d1b2:
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_50);
        tname.field_2._8_8_ = *ppcVar5;
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  ((string *)local_90,this_00,(cmGeneratorTarget *)tname.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_90,"/DependInfo.cmake");
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_90);
        poVar6 = std::operator<<((ostream *)cmakefileStream,"  \"");
        poVar6 = std::operator<<(poVar6,(string *)local_90);
        std::operator<<(poVar6,"\"\n");
        std::__cxx11::string::~string((string *)local_90);
      }
      else {
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_50);
        TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
        if (TVar2 == STATIC_LIBRARY) goto LAB_0070d1b2;
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_50);
        TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
        if (TVar2 == SHARED_LIBRARY) goto LAB_0070d1b2;
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_50);
        TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
        if (TVar2 == MODULE_LIBRARY) goto LAB_0070d1b2;
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_50);
        TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
        if (TVar2 == OBJECT_LIBRARY) goto LAB_0070d1b2;
        ppcVar5 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_50);
        TVar2 = cmGeneratorTarget::GetType(*ppcVar5);
        if (TVar2 == UTILITY) goto LAB_0070d1b2;
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_50,0);
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&l);
    tgts.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         tgts.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3
::WriteMainCMakefileLanguageRules(cmGeneratedFileStream& cmakefileStream,
                                  std::vector<cmLocalGenerator *> &lGenerators
                                  )
{
  cmLocalUnixMakefileGenerator3 *lg;

  // now list all the target info files
  cmakefileStream
    << "# Dependency information for all targets:\n";
  cmakefileStream
    << "set(CMAKE_DEPEND_INFO_FILES\n";
  for (unsigned int i = 0; i < lGenerators.size(); ++i)
    {
    lg = static_cast<cmLocalUnixMakefileGenerator3 *>(lGenerators[i]);
    // for all of out targets
    std::vector<cmGeneratorTarget*> tgts = lg->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::iterator l = tgts.begin();
         l != tgts.end(); l++)
      {
      if(((*l)->GetType() == cmState::EXECUTABLE) ||
         ((*l)->GetType() == cmState::STATIC_LIBRARY) ||
         ((*l)->GetType() == cmState::SHARED_LIBRARY) ||
         ((*l)->GetType() == cmState::MODULE_LIBRARY) ||
         ((*l)->GetType() == cmState::OBJECT_LIBRARY) ||
         ((*l)->GetType() == cmState::UTILITY))
        {
        cmGeneratorTarget* gt = *l;
        std::string tname = lg->GetRelativeTargetDirectory(gt);
        tname += "/DependInfo.cmake";
        cmSystemTools::ConvertToUnixSlashes(tname);
        cmakefileStream << "  \"" << tname << "\"\n";
        }
      }
    }
  cmakefileStream << "  )\n";
}